

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 auVar1 [16];
  float lhs;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  float *pfVar6;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float in_XMM0_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [64];
  float in_XMM1_Da;
  ImVec2 *in_stack_00000008;
  float grab_pos;
  float grab_t;
  float v_new_1;
  float new_clicked_t;
  float v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float x1;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 uVar18;
  undefined1 uVar19;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  ImGuiInputReadMode in_stack_ffffffffffffff48;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff4c;
  ImVec2 local_b0;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff84;
  float v_min_00;
  uint in_stack_ffffffffffffff8c;
  float t;
  undefined1 uVar20;
  byte bVar21;
  float in_stack_ffffffffffffff90;
  float local_54;
  undefined1 extraout_var [56];
  
  pIVar4 = GImGui;
  bVar7 = (in_R9D & 0x100000) != 0;
  bVar8 = in_EDX == 8;
  bVar9 = in_EDX == 9;
  uVar19 = bVar8 || bVar9;
  bVar10 = (in_R9D & 0x20) != 0;
  uVar18 = bVar10 && (bool)uVar19;
  fVar11 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  fVar12 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  fVar12 = (fVar11 - fVar12) - 4.0;
  local_54 = (pIVar4->Style).GrabMinSize;
  if (in_XMM1_Da <= in_XMM0_Da) {
    fVar16 = in_XMM0_Da - in_XMM1_Da;
  }
  else {
    fVar16 = in_XMM1_Da - in_XMM0_Da;
  }
  x1 = fVar16;
  if ((!bVar8 && !bVar9) && (0.0 <= fVar16)) {
    local_54 = ImMax<float>(fVar12 / (fVar16 + 1.0),(pIVar4->Style).GrabMinSize);
  }
  fVar13 = ImMin<float>(local_54,fVar12);
  lhs = fVar12 - fVar13;
  fVar14 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  fVar14 = fVar13 * 0.5 + fVar14 + 2.0;
  fVar15 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (bVar10 && (bVar8 || bVar9)) {
    if (bVar8 || bVar9) {
      in_stack_ffffffffffffff18 =
           (float)ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff18),
                             (int)in_stack_ffffffffffffff14);
    }
    else {
      in_stack_ffffffffffffff18 = 1.4013e-45;
    }
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff18;
    ImPow(0.0,3.024123e-39);
    in_stack_ffffffffffffff14 = (pIVar4->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(lhs,1.0);
  }
  bVar21 = 0;
  if (pIVar4->ActiveId == in_ESI) {
    t = (float)(in_stack_ffffffffffffff8c & 0xffff);
    v_min_00 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar4->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar6 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        in_stack_ffffffffffffff84 = *pfVar6;
        if (lhs <= 0.0) {
          in_stack_ffffffffffffff10 = 0.0;
        }
        else {
          in_stack_ffffffffffffff10 =
               ImClamp<float>((in_stack_ffffffffffffff84 - fVar14) / lhs,0.0,1.0);
        }
        v_min_00 = in_stack_ffffffffffffff10;
        if (bVar7) {
          v_min_00 = 1.0 - in_stack_ffffffffffffff10;
        }
        t = (float)CONCAT13((char)((uint)t >> 0x18),CONCAT12(1,SUB42(t,0)));
      }
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar4->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar4->SliderCurrentAccum = 0.0;
        pIVar4->SliderCurrentAccumDirty = false;
      }
      auVar17._0_8_ =
           GetNavInputAmount2d(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                               in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
      auVar17._8_56_ = extraout_var;
      in_stack_ffffffffffffff7c = vmovlpd_avx(auVar17._0_16_);
      if (bVar7) {
        in_stack_ffffffffffffff78 = -(float)((ulong)in_stack_ffffffffffffff7c >> 0x20);
      }
      else {
        in_stack_ffffffffffffff78 = (float)in_stack_ffffffffffffff7c;
      }
      if ((in_stack_ffffffffffffff78 != 0.0) || (NAN(in_stack_ffffffffffffff78))) {
        if (bVar8 || bVar9) {
          iVar5 = ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff18),
                             (int)in_stack_ffffffffffffff14);
        }
        else {
          iVar5 = 0;
        }
        if (iVar5 < 1) {
          if (((-100.0 <= fVar16) && (fVar16 <= 100.0)) || (bVar8 = IsNavInputDown(0xe), bVar8)) {
            auVar1 = vcmpss_avx(ZEXT416((uint)in_stack_ffffffffffffff78),ZEXT816(0) << 0x40,1);
            auVar1 = vblendvps_avx(SUB6416(ZEXT464(0x3f800000),0),SUB6416(ZEXT464(0xbf800000),0),
                                   auVar1);
            in_stack_ffffffffffffff78 = auVar1._0_4_ / fVar16;
          }
          else {
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 100.0;
          }
        }
        else {
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 100.0;
          bVar8 = IsNavInputDown(0xe);
          if (bVar8) {
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 10.0;
          }
        }
        bVar8 = IsNavInputDown(0xf);
        if (bVar8) {
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 * 10.0;
        }
        pIVar4->SliderCurrentAccum = in_stack_ffffffffffffff78 + pIVar4->SliderCurrentAccum;
        pIVar4->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff70 = pIVar4->SliderCurrentAccum;
      if ((pIVar4->NavActivatePressedId == in_ESI) && ((pIVar4->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar4->SliderCurrentAccumDirty & 1U) != 0) {
        v_min_00 = ScaleRatioFromValueT<float,float,float>
                             ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        uVar20 = (undefined1)((uint)t >> 0x18);
        if (((1.0 <= v_min_00) && (0.0 < in_stack_ffffffffffffff70)) ||
           ((v_min_00 <= 0.0 && (in_stack_ffffffffffffff70 < 0.0)))) {
          t = (float)CONCAT13(uVar20,(uint3)SUB42(t,0));
          pIVar4->SliderCurrentAccum = 0.0;
        }
        else {
          t = (float)CONCAT13(uVar20,CONCAT12(1,SUB42(t,0)));
          fVar16 = ImSaturate(v_min_00 + in_stack_ffffffffffffff70);
          in_stack_ffffffffffffff68 =
               ScaleValueFromRatioT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff90,t,fVar16,
                          in_stack_ffffffffffffff84,
                          SUB81((ulong)in_stack_ffffffffffffff7c >> 0x38,0),
                          (float)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff6c = v_min_00;
          if ((in_R9D & 0x40) == 0) {
            in_stack_ffffffffffffff68 =
                 RoundScalarWithFormatT<float,float>
                           ((char *)CONCAT44(v_min_00,in_stack_ffffffffffffff68),
                            (ImGuiDataType)in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff6c = v_min_00;
          }
          v_min_00 = fVar16;
          in_stack_ffffffffffffff64 =
               ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0),in_stack_ffffffffffffff5c
                          ,in_stack_ffffffffffffff58);
          if (in_stack_ffffffffffffff70 <= 0.0) {
            fVar16 = ImMax<float>(in_stack_ffffffffffffff64 - in_stack_ffffffffffffff6c,
                                  in_stack_ffffffffffffff70);
            pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar16;
          }
          else {
            fVar16 = ImMin<float>(in_stack_ffffffffffffff64 - in_stack_ffffffffffffff6c,
                                  in_stack_ffffffffffffff70);
            pIVar4->SliderCurrentAccum = pIVar4->SliderCurrentAccum - fVar16;
          }
        }
        pIVar4->SliderCurrentAccumDirty = false;
      }
    }
    if (((uint)t & 0x10000) != 0) {
      in_stack_ffffffffffffff60 =
           ScaleValueFromRatioT<float,float,float>
                     ((ImGuiDataType)in_stack_ffffffffffffff90,t,v_min_00,in_stack_ffffffffffffff84,
                      SUB81((ulong)in_stack_ffffffffffffff7c >> 0x38,0),
                      (float)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      if ((in_R9D & 0x40) == 0) {
        in_stack_ffffffffffffff60 =
             RoundScalarWithFormatT<float,float>
                       ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (ImGuiDataType)in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      }
      if ((*in_RCX != in_stack_ffffffffffffff60) || (NAN(*in_RCX) || NAN(in_stack_ffffffffffffff60))
         ) {
        *in_RCX = in_stack_ffffffffffffff60;
        t = 2.3509887e-38;
      }
    }
    bVar21 = (byte)((uint)t >> 0x18);
  }
  if (1.0 <= fVar12) {
    fVar12 = ScaleRatioFromValueT<float,float,float>
                       ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0),in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58);
    if (bVar7) {
      fVar12 = 1.0 - fVar12;
    }
    ImLerp<float>(fVar14,-fVar13 * 0.5 + (fVar15 - 2.0),fVar12);
    if (bVar7) {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar19,CONCAT16(uVar18,CONCAT24(in_stack_ffffffffffffff24,fVar11))),x1
                     ,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
      ;
      *in_stack_00000008 = local_d8;
      in_stack_00000008[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)
                     CONCAT17(uVar19,CONCAT16(uVar18,CONCAT24(in_stack_ffffffffffffff24,fVar11))),x1
                     ,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
      ;
      *in_stack_00000008 = local_c8;
      IVar2.y = in_stack_ffffffffffffff44;
      IVar2.x = in_stack_ffffffffffffff40;
      in_stack_00000008[1] = IVar2;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_b0,in_RDI,in_RDI);
    *in_stack_00000008 = local_b0;
    IVar3.y = in_stack_ffffffffffffff5c;
    IVar3.x = in_stack_ffffffffffffff58;
    in_stack_00000008[1] = IVar3;
  }
  return (bool)(bVar21 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}